

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_data_dictionary_get_definition
              (char *product_class_name,char *product_type_name,int version,
              coda_product_definition **definition)

{
  coda_product_class *product_class_00;
  coda_product_type *product_type_00;
  undefined8 local_48;
  coda_product_definition *product_definition;
  coda_product_type *product_type;
  coda_product_class *product_class;
  coda_product_definition **definition_local;
  int version_local;
  char *product_type_name_local;
  char *product_class_name_local;
  
  product_class_00 = coda_data_dictionary_get_product_class(product_class_name);
  if (product_class_00 == (coda_product_class *)0x0) {
    product_class_name_local._4_4_ = -1;
  }
  else {
    product_type_00 = coda_product_class_get_product_type(product_class_00,product_type_name);
    if (product_type_00 == (coda_product_type *)0x0) {
      product_class_name_local._4_4_ = -1;
    }
    else {
      if (version < 0) {
        local_48 = coda_product_type_get_latest_product_definition(product_type_00);
      }
      else {
        local_48 = coda_product_type_get_product_definition_by_version(product_type_00,version);
      }
      if (local_48 == (coda_product_definition *)0x0) {
        product_class_name_local._4_4_ = -1;
      }
      else {
        *definition = local_48;
        product_class_name_local._4_4_ = 0;
      }
    }
  }
  return product_class_name_local._4_4_;
}

Assistant:

int coda_data_dictionary_get_definition(const char *product_class_name, const char *product_type_name, int version,
                                        coda_product_definition **definition)
{
    const coda_product_class *product_class;
    const coda_product_type *product_type;
    coda_product_definition *product_definition = NULL;

    product_class = coda_data_dictionary_get_product_class(product_class_name);
    if (product_class == NULL)
    {
        return -1;
    }
    product_type = coda_product_class_get_product_type(product_class, product_type_name);
    if (product_type == NULL)
    {
        return -1;
    }
    if (version < 0)
    {
        product_definition = coda_product_type_get_latest_product_definition(product_type);
    }
    else
    {
        product_definition = coda_product_type_get_product_definition_by_version(product_type, version);
    }
    if (product_definition == NULL)
    {
        return -1;
    }

    *definition = product_definition;
    return 0;
}